

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::ExpectedPrefixesCollector::ConsumeLine
          (ExpectedPrefixesCollector *this,StringPiece *line,string *out_error)

{
  char *pcVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  stringpiece_ssize_type sVar2;
  mapped_type *this_01;
  undefined8 *puVar3;
  long *plVar4;
  ulong len;
  ulong uVar5;
  ulong *puVar6;
  StringPiece prefix;
  StringPiece package;
  key_type local_b0;
  StringPiece local_90;
  char local_80;
  undefined7 uStack_7f;
  StringPiece local_70;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  sVar2 = StringPiece::find(line,'=',0);
  len = (ulong)(int)sVar2;
  if (len == 0xffffffffffffffff) {
    local_70.ptr_ = (char *)local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Expected prefixes file line without equal sign: \'","");
    pcVar1 = line->ptr_;
    local_90.ptr_ = &local_80;
    if (pcVar1 == (char *)0x0) {
      local_90.length_ = 0;
      local_80 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,pcVar1,pcVar1 + line->length_);
    }
    uVar5 = 0xf;
    if ((ulong *)local_70.ptr_ != local_60) {
      uVar5 = local_60[0];
    }
    if (uVar5 < (ulong)(local_90.length_ + local_70.length_)) {
      uVar5 = 0xf;
      if (local_90.ptr_ != &local_80) {
        uVar5 = CONCAT71(uStack_7f,local_80);
      }
      if (uVar5 < (ulong)(local_90.length_ + local_70.length_)) goto LAB_002368e4;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70.ptr_);
    }
    else {
LAB_002368e4:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90.ptr_)
      ;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    puVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0.field_2._8_8_ = puVar3[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_b0._M_string_length = puVar3[1];
    *puVar3 = puVar6;
    puVar3[1] = 0;
    *(undefined1 *)puVar6 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_40 = *puVar6;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *puVar6;
      local_50 = (ulong *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_90.ptr_ != &local_80) {
      operator_delete(local_90.ptr_,CONCAT71(uStack_7f,local_80) + 1);
    }
    puVar6 = (ulong *)local_70.ptr_;
    if ((ulong *)local_70.ptr_ == local_60) goto LAB_00236a18;
  }
  else {
    StringPiece::StringPiece(&local_70,*line,0,len);
    StringPiece::StringPiece
              (&local_90,*line,(sVar2 << 0x20) + 0x100000000 >> 0x20,~len + line->length_);
    StringPieceTrimWhitespace(&local_70);
    StringPieceTrimWhitespace(&local_90);
    local_50 = &local_40;
    if (local_90.ptr_ == (char *)0x0) {
      local_48 = 0;
      local_40 = local_40 & 0xffffffffffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,local_90.ptr_,local_90.ptr_ + local_90.length_);
    }
    this_00 = this->prefix_map_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    if ((ulong *)local_70.ptr_ == (ulong *)0x0) {
      local_b0._M_string_length = 0;
      local_b0.field_2._M_allocated_capacity =
           local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,local_70.ptr_,local_70.length_ + (long)local_70.ptr_);
    }
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_00,&local_b0);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_60[0] = local_40;
    puVar6 = local_50;
    if (local_50 == &local_40) goto LAB_00236a18;
  }
  operator_delete(puVar6,local_60[0] + 1);
LAB_00236a18:
  return len != 0xffffffffffffffff;
}

Assistant:

bool ExpectedPrefixesCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find('=');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Expected prefixes file line without equal sign: '") +
        line.ToString() + "'.";
    return false;
  }
  StringPiece package(line, 0, offset);
  StringPiece prefix(line, offset + 1, line.length() - offset - 1);
  StringPieceTrimWhitespace(&package);
  StringPieceTrimWhitespace(&prefix);
  // Don't really worry about error checking the package/prefix for
  // being valid.  Assume the file is validated when it is created/edited.
  (*prefix_map_)[package.ToString()] = prefix.ToString();
  return true;
}